

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void clearkeys(global_State *g,GCObject *l,GCObject *f)

{
  byte bVar1;
  global_State *pgVar2;
  TValue *pTVar3;
  int iVar4;
  Table *h;
  TValue *o;
  
  if (l != (GCObject *)0x0) {
    do {
      bVar1 = (l->h).lsizenode;
      if (bVar1 != 0x1f) {
        pgVar2 = (l->th).l_G;
        o = (TValue *)&pgVar2->totalbytes;
        do {
          if ((((o[-1].tt_ != 0) && (iVar4 = iscleared(g,o), iVar4 != 0)) &&
              (o[-1].tt_ = 0, (o->tt_ & 0x40) != 0)) && (((byte)(o->value_).f[9] & 3) != 0)) {
            o->tt_ = 0xb;
          }
          pTVar3 = o + 1;
          o = (TValue *)&o[2].tt_;
        } while (&pTVar3->tt_ < &pgVar2->frealloc + (long)(1 << (bVar1 & 0x1f)) * 5);
      }
      l = (l->h).gclist;
    } while (l != (GCObject *)0x0);
  }
  return;
}

Assistant:

static void clearkeys (global_State *g, GCObject *l, GCObject *f) {
  for (; l != f; l = gco2t(l)->gclist) {
    Table *h = gco2t(l);
    Node *n, *limit = gnodelast(h);
    for (n = gnode(h, 0); n < limit; n++) {
      if (!ttisnil(gval(n)) && (iscleared(g, gkey(n)))) {
        setnilvalue(gval(n));  /* remove value ... */
        removeentry(n);  /* and remove entry from table */
      }
    }
  }
}